

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckArray2DCloseTrue::RunImpl(TestCheckArray2DCloseTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestResults results;
  float array2 [3] [3];
  float array1 [3] [3];
  float local_c8;
  int local_c4;
  TestDetails local_c0;
  TestResults local_a0;
  float local_88 [2];
  undefined1 auStack_80 [16];
  float afStack_70 [6];
  float local_58 [2];
  undefined1 auStack_50 [16];
  float afStack_40 [6];
  
  UnitTest::TestResults::TestResults(&local_a0,(TestReporter *)0x0);
  auStack_50._8_4_ = 2.5;
  auStack_50._12_4_ = 3.0;
  afStack_40[0] = 3.0;
  afStack_40[1] = 3.5;
  local_58[0] = 1.0;
  local_58[1] = 1.5;
  auStack_50._0_4_ = 2.0;
  auStack_50._4_4_ = 2.0;
  afStack_40[2] = 4.0;
  auStack_80._8_4_ = 2.51;
  auStack_80._12_4_ = 3.01;
  afStack_70[0] = 3.01;
  afStack_70[1] = 3.51;
  local_88[0] = 1.01;
  local_88[1] = 1.51;
  auStack_80._0_4_ = 2.01;
  auStack_80._4_4_ = 2.01;
  afStack_70[2] = 4.01;
  local_c8 = 0.02;
  UnitTest::TestDetails::TestDetails(&local_c0,"","","",0);
  UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
            (&local_a0,(float (*) [3] [3])local_58,(float (*) [3] [3])local_88,3,3,&local_c8,
             &local_c0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_c8 = 0.0;
  local_c4 = UnitTest::TestResults::GetFailureCount(&local_a0);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_c0,*ppTVar2,0xfb);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_c8,&local_c4,&local_c0);
  return;
}

Assistant:

TEST(CheckArray2DCloseTrue)
{
    TestResults results;

    float const array1[3][3] = { { 1.0f, 1.5f, 2.0f },
                                 { 2.0f, 2.5f, 3.0f },
                                 { 3.0f, 3.5f, 4.0f } };
    float const array2[3][3] = { { 1.01f, 1.51f, 2.01f },
                                 { 2.01f, 2.51f, 3.01f },
                                 { 3.01f, 3.51f, 4.01f } };
    CheckArray2DClose(results, array1, array2, 3, 3, 0.02f, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}